

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argsman_tests.cpp
# Opt level: O1

void __thiscall argsman_tests::util_GetArg::test_method(util_GetArg *this)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
  *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pUVar2;
  bool bVar3;
  int iVar4;
  vector<UniValue,std::allocator<UniValue>> *pvVar5;
  mapped_type *pmVar6;
  vector<UniValue,_std::allocator<UniValue>_> *pvVar7;
  iterator in_R8;
  iterator pvVar8;
  iterator in_R9;
  iterator pvVar9;
  long lVar10;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  undefined1 *local_5b8;
  undefined1 *local_5b0;
  char *local_5a8;
  char *local_5a0;
  undefined1 *local_598;
  undefined1 *local_590;
  char *local_588;
  char *local_580;
  undefined1 *local_578;
  undefined1 *local_570;
  char *local_568;
  char *local_560;
  undefined1 *local_558;
  undefined1 *local_550;
  char *local_548;
  char *local_540;
  undefined1 *local_538;
  undefined1 *local_530;
  char *local_528;
  char *local_520;
  undefined1 *local_518;
  undefined1 *local_510;
  char *local_508;
  char *local_500;
  undefined1 *local_4f8;
  undefined1 *local_4f0;
  char *local_4e8;
  char *local_4e0;
  undefined1 *local_4d8;
  undefined1 *local_4d0;
  char *local_4c8;
  char *local_4c0;
  undefined1 *local_4b8;
  undefined1 *local_4b0;
  char *local_4a8;
  char *local_4a0;
  undefined1 *local_498;
  undefined1 *local_490;
  char *local_488;
  char *local_480;
  undefined1 *local_478;
  undefined1 *local_470;
  char *local_468;
  char *local_460;
  undefined1 *local_458;
  undefined1 *local_450;
  char *local_448;
  char *local_440;
  undefined1 *local_438;
  undefined1 *local_430;
  char *local_428;
  char *local_420;
  char *local_418;
  string *local_410;
  char **local_408;
  char *local_400;
  assertion_result local_3f8;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock18;
  string local_3d0;
  string local_3b0;
  string local_390;
  undefined1 local_370 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_360;
  UniValue local_350;
  UniValue local_2f8;
  TestArgsManager testArgs;
  undefined1 local_58 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  ArgsManager::ArgsManager(&testArgs.super_ArgsManager);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&testArgs.super_ArgsManager.m_network_only_args._M_t);
  criticalblock18.super_unique_lock._M_owns = false;
  criticalblock18.super_unique_lock._M_device = (mutex_type *)&testArgs.super_ArgsManager;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock18.super_unique_lock);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
  ::clear(&testArgs.super_ArgsManager.m_settings.command_line_options._M_t);
  ::UniValue::UniValue<const_char_(&)[10],_char[10],_true>(&local_350,(char (*) [10])"string...");
  local_58._0_8_ = &local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"strtest1","");
  pvVar5 = (vector<UniValue,std::allocator<UniValue>> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
           ::operator[](&testArgs.super_ArgsManager.m_settings.command_line_options,
                        (key_type *)local_58);
  std::vector<UniValue,std::allocator<UniValue>>::_M_assign_aux<UniValue_const*>
            (pvVar5,&local_350,&local_2f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,local_48._M_allocated_capacity + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_350.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_350.keys);
  paVar1 = &local_350.val.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_350.val._M_dataplus._M_p._1_7_,local_350.val._M_dataplus._M_p._0_1_) !=
      paVar1) {
    operator_delete((undefined1 *)
                    CONCAT71(local_350.val._M_dataplus._M_p._1_7_,
                             local_350.val._M_dataplus._M_p._0_1_),
                    local_350.val.field_2._M_allocated_capacity + 1);
  }
  ::UniValue::UniValue<const_char_(&)[6],_char[6],_true>(&local_350,(char (*) [6])0xf6d7c7);
  local_58._0_8_ = &local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"inttest1","");
  pvVar5 = (vector<UniValue,std::allocator<UniValue>> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
           ::operator[](&testArgs.super_ArgsManager.m_settings.command_line_options,
                        (key_type *)local_58);
  std::vector<UniValue,std::allocator<UniValue>>::_M_assign_aux<UniValue_const*>
            (pvVar5,&local_350,&local_2f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,local_48._M_allocated_capacity + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_350.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_350.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_350.val._M_dataplus._M_p._1_7_,local_350.val._M_dataplus._M_p._0_1_) !=
      paVar1) {
    operator_delete((undefined1 *)
                    CONCAT71(local_350.val._M_dataplus._M_p._1_7_,
                             local_350.val._M_dataplus._M_p._0_1_),
                    local_350.val.field_2._M_allocated_capacity + 1);
  }
  ::UniValue::UniValue<const_char_(&)[18],_char[18],_true>
            (&local_350,(char (*) [18])"81985529216486895");
  local_58._0_8_ = &local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"inttest2","");
  pvVar5 = (vector<UniValue,std::allocator<UniValue>> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
           ::operator[](&testArgs.super_ArgsManager.m_settings.command_line_options,
                        (key_type *)local_58);
  std::vector<UniValue,std::allocator<UniValue>>::_M_assign_aux<UniValue_const*>
            (pvVar5,&local_350,&local_2f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,local_48._M_allocated_capacity + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_350.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_350.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_350.val._M_dataplus._M_p._1_7_,local_350.val._M_dataplus._M_p._0_1_) !=
      paVar1) {
    operator_delete((undefined1 *)
                    CONCAT71(local_350.val._M_dataplus._M_p._1_7_,
                             local_350.val._M_dataplus._M_p._0_1_),
                    local_350.val.field_2._M_allocated_capacity + 1);
  }
  ::UniValue::UniValue<const_char_(&)[1],_char[1],_true>(&local_350,(char (*) [1])0xf6cf21);
  local_58._0_8_ = &local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"booltest1","");
  pvVar5 = (vector<UniValue,std::allocator<UniValue>> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
           ::operator[](&testArgs.super_ArgsManager.m_settings.command_line_options,
                        (key_type *)local_58);
  std::vector<UniValue,std::allocator<UniValue>>::_M_assign_aux<UniValue_const*>
            (pvVar5,&local_350,&local_2f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,local_48._M_allocated_capacity + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_350.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_350.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_350.val._M_dataplus._M_p._1_7_,local_350.val._M_dataplus._M_p._0_1_) !=
      paVar1) {
    operator_delete((undefined1 *)
                    CONCAT71(local_350.val._M_dataplus._M_p._1_7_,
                             local_350.val._M_dataplus._M_p._0_1_),
                    local_350.val.field_2._M_allocated_capacity + 1);
  }
  ::UniValue::UniValue<const_char_(&)[2],_char[2],_true>(&local_350,(char (*) [2])0xfbe1bd);
  local_58._0_8_ = &local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"booltest3","");
  pvVar5 = (vector<UniValue,std::allocator<UniValue>> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
           ::operator[](&testArgs.super_ArgsManager.m_settings.command_line_options,
                        (key_type *)local_58);
  std::vector<UniValue,std::allocator<UniValue>>::_M_assign_aux<UniValue_const*>
            (pvVar5,&local_350,&local_2f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,local_48._M_allocated_capacity + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_350.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_350.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_350.val._M_dataplus._M_p._1_7_,local_350.val._M_dataplus._M_p._0_1_) !=
      paVar1) {
    operator_delete((undefined1 *)
                    CONCAT71(local_350.val._M_dataplus._M_p._1_7_,
                             local_350.val._M_dataplus._M_p._0_1_),
                    local_350.val.field_2._M_allocated_capacity + 1);
  }
  ::UniValue::UniValue<const_char_(&)[2],_char[2],_true>(&local_350,(char (*) [2])0xf6d961);
  local_58._0_8_ = &local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"booltest4","");
  pvVar5 = (vector<UniValue,std::allocator<UniValue>> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
           ::operator[](&testArgs.super_ArgsManager.m_settings.command_line_options,
                        (key_type *)local_58);
  std::vector<UniValue,std::allocator<UniValue>>::_M_assign_aux<UniValue_const*>
            (pvVar5,&local_350,&local_2f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,local_48._M_allocated_capacity + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_350.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_350.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_350.val._M_dataplus._M_p._1_7_,local_350.val._M_dataplus._M_p._0_1_) !=
      paVar1) {
    operator_delete((undefined1 *)
                    CONCAT71(local_350.val._M_dataplus._M_p._1_7_,
                             local_350.val._M_dataplus._M_p._0_1_),
                    local_350.val.field_2._M_allocated_capacity + 1);
  }
  ::UniValue::UniValue<const_char_(&)[2],_char[2],_true>(&local_350,(char (*) [2])0xe981ba);
  ::UniValue::UniValue<const_char_(&)[2],_char[2],_true>(&local_2f8,(char (*) [2])0xe55f2d);
  local_58._0_8_ = &local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"pritest1","");
  pvVar5 = (vector<UniValue,std::allocator<UniValue>> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
           ::operator[](&testArgs.super_ArgsManager.m_settings.command_line_options,
                        (key_type *)local_58);
  std::vector<UniValue,std::allocator<UniValue>>::_M_assign_aux<UniValue_const*>
            (pvVar5,&local_350,&testArgs);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,local_48._M_allocated_capacity + 1);
  }
  lVar10 = -0xb0;
  pvVar7 = &local_2f8.values;
  do {
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector(pvVar7);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(pvVar7 + -1));
    pUVar2 = pvVar7[-3].super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    if ((pointer)((long)(pvVar7 + -2) + 8) != pUVar2) {
      operator_delete(pUVar2,(ulong)((long)&((pointer)
                                            ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                              *)((long)(pvVar7 + -2) + 8))->_M_allocated_capacity)->
                                            typ + 1));
    }
    pvVar7 = (vector<UniValue,_std::allocator<UniValue>_> *)
             &pvVar7[-4].super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_finish;
    lVar10 = lVar10 + 0x58;
  } while (lVar10 != 0);
  ::UniValue::UniValue<const_char_(&)[2],_char[2],_true>(&local_350,(char (*) [2])0xe981ba);
  ::UniValue::UniValue<const_char_(&)[2],_char[2],_true>(&local_2f8,(char (*) [2])0xe55f2d);
  local_58._0_8_ = &local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"");
  this_00 = &testArgs.super_ArgsManager.m_settings.ro_config;
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
           ::operator[](this_00,(key_type *)local_58);
  local_370._0_8_ = &local_360;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_370,"pritest2","");
  pvVar5 = (vector<UniValue,std::allocator<UniValue>> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
           ::operator[](pmVar6,(key_type *)local_370);
  std::vector<UniValue,std::allocator<UniValue>>::_M_assign_aux<UniValue_const*>
            (pvVar5,&local_350,&testArgs);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370._0_8_ != &local_360) {
    operator_delete((void *)local_370._0_8_,(ulong)(local_360._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,local_48._M_allocated_capacity + 1);
  }
  lVar10 = -0xb0;
  pvVar7 = &local_2f8.values;
  do {
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector(pvVar7);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(pvVar7 + -1));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)((long)(pvVar7 + -2) + 8) !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*(undefined1 **)((long)(pvVar7 + -3) + 0x10)) {
      operator_delete(*(undefined1 **)((long)(pvVar7 + -3) + 0x10),
                      ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)((long)(pvVar7 + -2) + 8))->_M_allocated_capacity + 1);
    }
    pvVar7 = (vector<UniValue,_std::allocator<UniValue>_> *)((long)(pvVar7 + -4) + 8);
    lVar10 = lVar10 + 0x58;
  } while (lVar10 != 0);
  ::UniValue::UniValue<const_char_(&)[2],_char[2],_true>(&local_350,(char (*) [2])0xe981ba);
  local_58._0_8_ = &local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"pritest3","");
  pvVar5 = (vector<UniValue,std::allocator<UniValue>> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
           ::operator[](&testArgs.super_ArgsManager.m_settings.command_line_options,
                        (key_type *)local_58);
  std::vector<UniValue,std::allocator<UniValue>>::_M_assign_aux<UniValue_const*>
            (pvVar5,&local_350,&local_2f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,local_48._M_allocated_capacity + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_350.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_350.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_350.val._M_dataplus._M_p._1_7_,local_350.val._M_dataplus._M_p._0_1_) !=
      paVar1) {
    operator_delete((undefined1 *)
                    CONCAT71(local_350.val._M_dataplus._M_p._1_7_,
                             local_350.val._M_dataplus._M_p._0_1_),
                    local_350.val.field_2._M_allocated_capacity + 1);
  }
  ::UniValue::UniValue<const_char_(&)[2],_char[2],_true>(&local_350,(char (*) [2])0xe55f2d);
  local_58._0_8_ = &local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"");
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
           ::operator[](this_00,(key_type *)local_58);
  local_370._0_8_ = &local_360;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_370,"pritest3","");
  pvVar5 = (vector<UniValue,std::allocator<UniValue>> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
           ::operator[](pmVar6,(key_type *)local_370);
  std::vector<UniValue,std::allocator<UniValue>>::_M_assign_aux<UniValue_const*>
            (pvVar5,&local_350,&local_2f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370._0_8_ != &local_360) {
    operator_delete((void *)local_370._0_8_,(ulong)(local_360._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,local_48._M_allocated_capacity + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_350.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_350.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_350.val._M_dataplus._M_p._1_7_,local_350.val._M_dataplus._M_p._0_1_) !=
      paVar1) {
    operator_delete((undefined1 *)
                    CONCAT71(local_350.val._M_dataplus._M_p._1_7_,
                             local_350.val._M_dataplus._M_p._0_1_),
                    local_350.val.field_2._M_allocated_capacity + 1);
  }
  ::UniValue::UniValue<const_char_(&)[2],_char[2],_true>(&local_350,(char (*) [2])0xe981ba);
  ::UniValue::UniValue<const_char_(&)[2],_char[2],_true>(&local_2f8,(char (*) [2])0xe55f2d);
  local_58._0_8_ = &local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"pritest4","");
  pvVar5 = (vector<UniValue,std::allocator<UniValue>> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
           ::operator[](&testArgs.super_ArgsManager.m_settings.command_line_options,
                        (key_type *)local_58);
  std::vector<UniValue,std::allocator<UniValue>>::_M_assign_aux<UniValue_const*>
            (pvVar5,&local_350,&testArgs);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,local_48._M_allocated_capacity + 1);
  }
  lVar10 = -0xb0;
  pvVar7 = &local_2f8.values;
  do {
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector(pvVar7);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(pvVar7 + -1));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)((long)(pvVar7 + -2) + 8) !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*(undefined1 **)((long)(pvVar7 + -3) + 0x10)) {
      operator_delete(*(undefined1 **)((long)(pvVar7 + -3) + 0x10),
                      ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)((long)(pvVar7 + -2) + 8))->_M_allocated_capacity + 1);
    }
    pvVar7 = (vector<UniValue,_std::allocator<UniValue>_> *)((long)(pvVar7 + -4) + 8);
    lVar10 = lVar10 + 0x58;
  } while (lVar10 != 0);
  ::UniValue::UniValue<const_char_(&)[2],_char[2],_true>(&local_350,(char (*) [2])0xf6c195);
  ::UniValue::UniValue<const_char_(&)[2],_char[2],_true>(&local_2f8,(char (*) [2])0xf6c19d);
  local_58._0_8_ = &local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"");
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
           ::operator[](this_00,(key_type *)local_58);
  local_370._0_8_ = &local_360;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_370,"pritest4","");
  pvVar5 = (vector<UniValue,std::allocator<UniValue>> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
           ::operator[](pmVar6,(key_type *)local_370);
  std::vector<UniValue,std::allocator<UniValue>>::_M_assign_aux<UniValue_const*>
            (pvVar5,&local_350,&testArgs);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370._0_8_ != &local_360) {
    operator_delete((void *)local_370._0_8_,(ulong)(local_360._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,local_48._M_allocated_capacity + 1);
  }
  lVar10 = -0xb0;
  pvVar7 = &local_2f8.values;
  do {
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector(pvVar7);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(pvVar7 + -1));
    pUVar2 = pvVar7[-3].super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    if ((pointer)((long)(pvVar7 + -2) + 8) != pUVar2) {
      operator_delete(pUVar2,(ulong)((long)&((pointer)
                                            ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                              *)((long)(pvVar7 + -2) + 8))->_M_allocated_capacity)->
                                            typ + 1));
    }
    pvVar7 = (vector<UniValue,_std::allocator<UniValue>_> *)
             &pvVar7[-4].super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_finish;
    lVar10 = lVar10 + 0x58;
  } while (lVar10 != 0);
  local_428 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_420 = "";
  local_438 = &boost::unit_test::basic_cstring<char_const>::null;
  local_430 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x273;
  file.m_begin = (iterator)&local_428;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_438,msg);
  local_370[8] = false;
  local_370._0_8_ = &PTR__lazy_ostream_013abb30;
  local_360._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_360._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  paVar1 = &local_3b0.field_2;
  local_3b0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"strtest1","");
  local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"default","");
  ArgsManager::GetArg(&local_390,&testArgs.super_ArgsManager,&local_3b0,&local_3d0);
  iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_390,"string...");
  local_3f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar4 == 0);
  local_3f8.m_message.px = (element_type *)0x0;
  local_3f8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_408 = (char **)0xe56179;
  local_400 = "";
  local_350.val.field_2._M_allocated_capacity = (size_type)&local_410;
  local_350.val._M_dataplus._M_p._0_1_ = 0;
  local_350._0_8_ = &PTR__lazy_ostream_013abbf0;
  local_350.val._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_418;
  local_418 = "string...";
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_013ac370;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  local_410 = &local_390;
  boost::test_tools::tt_detail::report_assertion
            (&local_3f8,(lazy_ostream *)local_370,1,2,REQUIRE,0xe57d76,(size_t)&local_408,0x273,
             &local_350,"\"string...\"",local_58);
  boost::detail::shared_count::~shared_count(&local_3f8.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != &local_390.field_2) {
    operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
    operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
  }
  local_448 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_440 = "";
  local_458 = &boost::unit_test::basic_cstring<char_const>::null;
  local_450 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x274;
  file_00.m_begin = (iterator)&local_448;
  msg_00.m_end = pvVar9;
  msg_00.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_458,
             msg_00);
  local_370[8] = false;
  local_370._0_8_ = &PTR__lazy_ostream_013abb30;
  local_360._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_360._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_3b0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"strtest2","");
  local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"default","");
  ArgsManager::GetArg(&local_390,&testArgs.super_ArgsManager,&local_3b0,&local_3d0);
  iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_390,"default");
  local_3f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar4 == 0);
  local_3f8.m_message.px = (element_type *)0x0;
  local_3f8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_408 = (char **)0xe56179;
  local_400 = "";
  local_350.val._M_dataplus._M_p._0_1_ = 0;
  local_350._0_8_ = &PTR__lazy_ostream_013abbf0;
  local_350.val._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  local_350.val.field_2._M_allocated_capacity = (size_type)&local_410;
  local_418 = "default";
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_013ac3b0;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_418;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  local_410 = &local_390;
  boost::test_tools::tt_detail::report_assertion
            (&local_3f8,(lazy_ostream *)local_370,1,2,REQUIRE,0xe57db2,(size_t)&local_408,0x274,
             &local_350,"\"default\"",local_58);
  boost::detail::shared_count::~shared_count(&local_3f8.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != &local_390.field_2) {
    operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
    operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
    operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
  }
  local_468 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_460 = "";
  local_478 = &boost::unit_test::basic_cstring<char_const>::null;
  local_470 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x275;
  file_01.m_begin = (iterator)&local_468;
  msg_01.m_end = pvVar9;
  msg_01.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_478,
             msg_01);
  local_370[8] = false;
  local_370._0_8_ = &PTR__lazy_ostream_013abb30;
  local_360._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_360._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"inttest1","");
  local_410 = (string *)ArgsManager::GetIntArg(&testArgs.super_ArgsManager,&local_390,-1);
  local_3b0._M_dataplus._M_p._0_1_ = local_410 == (string *)0x3039;
  local_418 = (char *)CONCAT44(local_418._4_4_,0x3039);
  local_3b0._M_string_length = 0;
  local_3b0.field_2._M_allocated_capacity = 0;
  local_3d0._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_3d0._M_string_length = 0xe561df;
  local_3f8._0_8_ = &local_410;
  local_350.val._M_dataplus._M_p._0_1_ = 0;
  local_350._0_8_ = &PTR__lazy_ostream_013abed0;
  local_350.val._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  local_350.val.field_2._M_allocated_capacity = (size_type)&local_3f8;
  local_408 = &local_418;
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_013abcf0;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_408;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_3b0,(lazy_ostream *)local_370,1,2,REQUIRE,0xe57de3,
             (size_t)&local_3d0,0x275,&local_350,"12345",local_58);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_3b0.field_2._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != &local_390.field_2) {
    operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
  }
  local_488 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_480 = "";
  local_498 = &boost::unit_test::basic_cstring<char_const>::null;
  local_490 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x276;
  file_02.m_begin = (iterator)&local_488;
  msg_02.m_end = pvVar9;
  msg_02.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_498,
             msg_02);
  local_370[8] = false;
  local_370._0_8_ = &PTR__lazy_ostream_013abb30;
  local_360._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_360._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"inttest2","");
  local_410 = (string *)ArgsManager::GetIntArg(&testArgs.super_ArgsManager,&local_390,-1);
  local_418 = (char *)0x123456789abcdef;
  local_3b0._M_dataplus._M_p._0_1_ = local_410 == (string *)0x123456789abcdef;
  local_3b0._M_string_length = 0;
  local_3b0.field_2._M_allocated_capacity = 0;
  local_3d0._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_3d0._M_string_length = 0xe561df;
  local_3f8._0_8_ = &local_410;
  local_350.val._M_dataplus._M_p._0_1_ = 0;
  local_350._0_8_ = &PTR__lazy_ostream_013abed0;
  local_350.val._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  local_350.val.field_2._M_allocated_capacity = (size_type)&local_3f8;
  local_408 = &local_418;
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_013ac3f0;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_408;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_3b0,(lazy_ostream *)local_370,1,2,REQUIRE,0xe57e06,
             (size_t)&local_3d0,0x276,&local_350,"81985529216486895LL",local_58);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_3b0.field_2._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != &local_390.field_2) {
    operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
  }
  local_4a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_4a0 = "";
  local_4b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x277;
  file_03.m_begin = (iterator)&local_4a8;
  msg_03.m_end = pvVar9;
  msg_03.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_4b8,
             msg_03);
  local_370[8] = false;
  local_370._0_8_ = &PTR__lazy_ostream_013abb30;
  local_360._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_360._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"inttest3","");
  local_410 = (string *)ArgsManager::GetIntArg(&testArgs.super_ArgsManager,&local_390,-1);
  local_418 = (char *)CONCAT44(local_418._4_4_,0xffffffff);
  local_3b0._M_dataplus._M_p._0_1_ = local_410 == (string *)0xffffffffffffffff;
  local_3b0._M_string_length = 0;
  local_3b0.field_2._M_allocated_capacity = 0;
  local_3d0._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_3d0._M_string_length = 0xe561df;
  local_3f8._0_8_ = &local_410;
  local_350.val._M_dataplus._M_p._0_1_ = 0;
  local_350._0_8_ = &PTR__lazy_ostream_013abed0;
  local_350.val._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  local_350.val.field_2._M_allocated_capacity = (size_type)&local_3f8;
  local_408 = &local_418;
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_013abcf0;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_408;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_3b0,(lazy_ostream *)local_370,1,2,REQUIRE,0xe57e46,
             (size_t)&local_3d0,0x277,&local_350,"-1",local_58);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_3b0.field_2._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != &local_390.field_2) {
    operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
  }
  local_4c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_4c0 = "";
  local_4d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x278;
  file_04.m_begin = (iterator)&local_4c8;
  msg_04.m_end = pvVar9;
  msg_04.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_4d8,
             msg_04);
  local_370[8] = false;
  local_370._0_8_ = &PTR__lazy_ostream_013abb30;
  local_360._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_360._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"booltest1","");
  bVar3 = ArgsManager::GetBoolArg(&testArgs.super_ArgsManager,&local_390,false);
  local_410 = (string *)CONCAT71(local_410._1_7_,bVar3);
  local_418 = (char *)CONCAT71(local_418._1_7_,1);
  local_3b0._M_dataplus._M_p._0_1_ = bVar3;
  local_3b0._M_string_length = 0;
  local_3b0.field_2._M_allocated_capacity = 0;
  local_3d0._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_3d0._M_string_length = 0xe561df;
  local_3f8._0_8_ = &local_410;
  local_350.val._M_dataplus._M_p._0_1_ = 0;
  local_350._0_8_ = &PTR__lazy_ostream_013abe90;
  local_350.val._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  local_350.val.field_2._M_allocated_capacity = (size_type)&local_3f8;
  local_408 = &local_418;
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_013abe90;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_408;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_3b0,(lazy_ostream *)local_370,1,2,REQUIRE,0xe57e69,
             (size_t)&local_3d0,0x278,&local_350,"true",local_58);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_3b0.field_2._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != &local_390.field_2) {
    operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
  }
  local_4e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_4e0 = "";
  local_4f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x279;
  file_05.m_begin = (iterator)&local_4e8;
  msg_05.m_end = pvVar9;
  msg_05.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_4f8,
             msg_05);
  local_370[8] = false;
  local_370._0_8_ = &PTR__lazy_ostream_013abb30;
  local_360._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_360._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"booltest2","");
  bVar3 = ArgsManager::GetBoolArg(&testArgs.super_ArgsManager,&local_390,false);
  local_410 = (string *)CONCAT71(local_410._1_7_,bVar3);
  local_418 = (char *)((ulong)local_418 & 0xffffffffffffff00);
  local_3b0._M_dataplus._M_p._0_1_ = !bVar3;
  local_3b0._M_string_length = 0;
  local_3b0.field_2._M_allocated_capacity = 0;
  local_3d0._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_3d0._M_string_length = 0xe561df;
  local_3f8._0_8_ = &local_410;
  local_350.val._M_dataplus._M_p._0_1_ = 0;
  local_350._0_8_ = &PTR__lazy_ostream_013abe90;
  local_350.val._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  local_350.val.field_2._M_allocated_capacity = (size_type)&local_3f8;
  local_408 = &local_418;
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_013abe90;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_408;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_3b0,(lazy_ostream *)local_370,1,2,REQUIRE,0xe57e9b,
             (size_t)&local_3d0,0x279,&local_350,"false",local_58);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_3b0.field_2._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != &local_390.field_2) {
    operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
  }
  local_508 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_500 = "";
  local_518 = &boost::unit_test::basic_cstring<char_const>::null;
  local_510 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x27a;
  file_06.m_begin = (iterator)&local_508;
  msg_06.m_end = pvVar9;
  msg_06.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_518,
             msg_06);
  local_370[8] = false;
  local_370._0_8_ = &PTR__lazy_ostream_013abb30;
  local_360._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_360._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"booltest3","");
  bVar3 = ArgsManager::GetBoolArg(&testArgs.super_ArgsManager,&local_390,false);
  local_410 = (string *)CONCAT71(local_410._1_7_,bVar3);
  local_418 = (char *)((ulong)local_418 & 0xffffffffffffff00);
  local_3b0._M_dataplus._M_p._0_1_ = !bVar3;
  local_3b0._M_string_length = 0;
  local_3b0.field_2._M_allocated_capacity = 0;
  local_3d0._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_3d0._M_string_length = 0xe561df;
  local_3f8._0_8_ = &local_410;
  local_350.val._M_dataplus._M_p._0_1_ = 0;
  local_350._0_8_ = &PTR__lazy_ostream_013abe90;
  local_350.val._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  local_350.val.field_2._M_allocated_capacity = (size_type)&local_3f8;
  local_408 = &local_418;
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_013abe90;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_408;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_3b0,(lazy_ostream *)local_370,1,2,REQUIRE,0xe57ec3,
             (size_t)&local_3d0,0x27a,&local_350,"false",local_58);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_3b0.field_2._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != &local_390.field_2) {
    operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
  }
  local_528 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_520 = "";
  local_538 = &boost::unit_test::basic_cstring<char_const>::null;
  local_530 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x27b;
  file_07.m_begin = (iterator)&local_528;
  msg_07.m_end = pvVar9;
  msg_07.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_538,
             msg_07);
  local_370[8] = false;
  local_370._0_8_ = &PTR__lazy_ostream_013abb30;
  local_360._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_360._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"booltest4","");
  bVar3 = ArgsManager::GetBoolArg(&testArgs.super_ArgsManager,&local_390,false);
  local_410 = (string *)CONCAT71(local_410._1_7_,bVar3);
  local_418 = (char *)CONCAT71(local_418._1_7_,1);
  local_3b0._M_dataplus._M_p._0_1_ = bVar3;
  local_3b0._M_string_length = 0;
  local_3b0.field_2._M_allocated_capacity = 0;
  local_3d0._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_3d0._M_string_length = 0xe561df;
  local_3f8._0_8_ = &local_410;
  local_350.val._M_dataplus._M_p._0_1_ = 0;
  local_350._0_8_ = &PTR__lazy_ostream_013abe90;
  local_350.val._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  local_350.val.field_2._M_allocated_capacity = (size_type)&local_3f8;
  local_408 = &local_418;
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_013abe90;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_408;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_3b0,(lazy_ostream *)local_370,1,2,REQUIRE,0xe57eeb,
             (size_t)&local_3d0,0x27b,&local_350,"true",local_58);
  paVar1 = &local_3b0.field_2;
  boost::detail::shared_count::~shared_count((shared_count *)&paVar1->_M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != &local_390.field_2) {
    operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
  }
  local_548 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_540 = "";
  local_558 = &boost::unit_test::basic_cstring<char_const>::null;
  local_550 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x27d;
  file_08.m_begin = (iterator)&local_548;
  msg_08.m_end = pvVar9;
  msg_08.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_558,
             msg_08);
  local_370[8] = false;
  local_370._0_8_ = &PTR__lazy_ostream_013abb30;
  local_360._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_360._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_3b0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"pritest1","");
  local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"default","");
  ArgsManager::GetArg(&local_390,&testArgs.super_ArgsManager,&local_3b0,&local_3d0);
  iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_390,"b");
  local_3f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar4 == 0);
  local_3f8.m_message.px = (element_type *)0x0;
  local_3f8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_408 = (char **)0xe56179;
  local_400 = "";
  local_350.val._M_dataplus._M_p._0_1_ = 0;
  local_350._0_8_ = &PTR__lazy_ostream_013abbf0;
  local_350.val._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  local_350.val.field_2._M_allocated_capacity = (size_type)&local_410;
  local_418 = "b";
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_013ac2b0;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_418;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  local_410 = &local_390;
  boost::test_tools::tt_detail::report_assertion
            (&local_3f8,(lazy_ostream *)local_370,1,2,REQUIRE,0xe57f13,(size_t)&local_408,0x27d,
             &local_350,"\"b\"",local_58);
  boost::detail::shared_count::~shared_count(&local_3f8.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != &local_390.field_2) {
    operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
    operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
  }
  local_568 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_560 = "";
  local_578 = &boost::unit_test::basic_cstring<char_const>::null;
  local_570 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x27e;
  file_09.m_begin = (iterator)&local_568;
  msg_09.m_end = pvVar9;
  msg_09.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_578,
             msg_09);
  local_370[8] = false;
  local_370._0_8_ = &PTR__lazy_ostream_013abb30;
  local_360._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_360._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_3b0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"pritest2","");
  local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"default","");
  ArgsManager::GetArg(&local_390,&testArgs.super_ArgsManager,&local_3b0,&local_3d0);
  iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_390,"a");
  local_3f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar4 == 0);
  local_3f8.m_message.px = (element_type *)0x0;
  local_3f8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_408 = (char **)0xe56179;
  local_400 = "";
  local_350.val._M_dataplus._M_p._0_1_ = 0;
  local_350._0_8_ = &PTR__lazy_ostream_013abbf0;
  local_350.val._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  local_350.val.field_2._M_allocated_capacity = (size_type)&local_410;
  local_418 = "a";
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_013ac2b0;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_418;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  local_410 = &local_390;
  boost::test_tools::tt_detail::report_assertion
            (&local_3f8,(lazy_ostream *)local_370,1,2,REQUIRE,0xe57f3e,(size_t)&local_408,0x27e,
             &local_350,"\"a\"",local_58);
  boost::detail::shared_count::~shared_count(&local_3f8.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != &local_390.field_2) {
    operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
    operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
  }
  local_588 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_580 = "";
  local_598 = &boost::unit_test::basic_cstring<char_const>::null;
  local_590 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x27f;
  file_10.m_begin = (iterator)&local_588;
  msg_10.m_end = pvVar9;
  msg_10.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_598,
             msg_10);
  local_370[8] = false;
  local_370._0_8_ = &PTR__lazy_ostream_013abb30;
  local_360._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_360._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_3b0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"pritest3","");
  local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"default","");
  ArgsManager::GetArg(&local_390,&testArgs.super_ArgsManager,&local_3b0,&local_3d0);
  iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_390,"a");
  local_3f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar4 == 0);
  local_3f8.m_message.px = (element_type *)0x0;
  local_3f8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_408 = (char **)0xe56179;
  local_400 = "";
  local_350.val._M_dataplus._M_p._0_1_ = 0;
  local_350._0_8_ = &PTR__lazy_ostream_013abbf0;
  local_350.val._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  local_350.val.field_2._M_allocated_capacity = (size_type)&local_410;
  local_418 = "a";
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_013ac2b0;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_418;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  local_410 = &local_390;
  boost::test_tools::tt_detail::report_assertion
            (&local_3f8,(lazy_ostream *)local_370,1,2,REQUIRE,0xe57f69,(size_t)&local_408,0x27f,
             &local_350,"\"a\"",local_58);
  boost::detail::shared_count::~shared_count(&local_3f8.m_message.pn);
  paVar1 = &local_3b0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != &local_390.field_2) {
    operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
    operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
  }
  local_5a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_5a0 = "";
  local_5b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x280;
  file_11.m_begin = (iterator)&local_5a8;
  msg_11.m_end = pvVar9;
  msg_11.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_5b8,
             msg_11);
  local_370[8] = false;
  local_370._0_8_ = &PTR__lazy_ostream_013abb30;
  local_360._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_360._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_3b0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"pritest4","");
  local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"default","");
  ArgsManager::GetArg(&local_390,&testArgs.super_ArgsManager,&local_3b0,&local_3d0);
  iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_390,"b");
  local_3f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar4 == 0);
  local_3f8.m_message.px = (element_type *)0x0;
  local_3f8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_408 = (char **)0xe56179;
  local_400 = "";
  local_350.val._M_dataplus._M_p._0_1_ = 0;
  local_350._0_8_ = &PTR__lazy_ostream_013abbf0;
  local_350.val._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  local_350.val.field_2._M_allocated_capacity = (size_type)&local_410;
  local_418 = "b";
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_013ac2b0;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_418;
  local_410 = &local_390;
  boost::test_tools::tt_detail::report_assertion
            (&local_3f8,(lazy_ostream *)local_370,1,2,REQUIRE,0xe57f90,(size_t)&local_408,0x280,
             &local_350,"\"b\"",local_58);
  boost::detail::shared_count::~shared_count(&local_3f8.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != &local_390.field_2) {
    operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
    operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock18.super_unique_lock);
  ArgsManager::~ArgsManager(&testArgs.super_ArgsManager);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(util_GetArg)
{
    TestArgsManager testArgs;
    LOCK(testArgs.cs_args);
    testArgs.m_settings.command_line_options.clear();
    testArgs.m_settings.command_line_options["strtest1"] = {"string..."};
    // strtest2 undefined on purpose
    testArgs.m_settings.command_line_options["inttest1"] = {"12345"};
    testArgs.m_settings.command_line_options["inttest2"] = {"81985529216486895"};
    // inttest3 undefined on purpose
    testArgs.m_settings.command_line_options["booltest1"] = {""};
    // booltest2 undefined on purpose
    testArgs.m_settings.command_line_options["booltest3"] = {"0"};
    testArgs.m_settings.command_line_options["booltest4"] = {"1"};

    // priorities
    testArgs.m_settings.command_line_options["pritest1"] = {"a", "b"};
    testArgs.m_settings.ro_config[""]["pritest2"] = {"a", "b"};
    testArgs.m_settings.command_line_options["pritest3"] = {"a"};
    testArgs.m_settings.ro_config[""]["pritest3"] = {"b"};
    testArgs.m_settings.command_line_options["pritest4"] = {"a","b"};
    testArgs.m_settings.ro_config[""]["pritest4"] = {"c","d"};

    BOOST_CHECK_EQUAL(testArgs.GetArg("strtest1", "default"), "string...");
    BOOST_CHECK_EQUAL(testArgs.GetArg("strtest2", "default"), "default");
    BOOST_CHECK_EQUAL(testArgs.GetIntArg("inttest1", -1), 12345);
    BOOST_CHECK_EQUAL(testArgs.GetIntArg("inttest2", -1), 81985529216486895LL);
    BOOST_CHECK_EQUAL(testArgs.GetIntArg("inttest3", -1), -1);
    BOOST_CHECK_EQUAL(testArgs.GetBoolArg("booltest1", false), true);
    BOOST_CHECK_EQUAL(testArgs.GetBoolArg("booltest2", false), false);
    BOOST_CHECK_EQUAL(testArgs.GetBoolArg("booltest3", false), false);
    BOOST_CHECK_EQUAL(testArgs.GetBoolArg("booltest4", false), true);

    BOOST_CHECK_EQUAL(testArgs.GetArg("pritest1", "default"), "b");
    BOOST_CHECK_EQUAL(testArgs.GetArg("pritest2", "default"), "a");
    BOOST_CHECK_EQUAL(testArgs.GetArg("pritest3", "default"), "a");
    BOOST_CHECK_EQUAL(testArgs.GetArg("pritest4", "default"), "b");
}